

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O0

int Teleport::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  int iVar1;
  EffectData *pEVar2;
  SharedMemoryHandle *this;
  SharedMemory *pSVar3;
  Stream *s;
  SharedMemoryHandle *shared;
  int stream;
  EffectData *data;
  float value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Teleport::EffectData>(state);
  if (index < 8) {
    if ((index < 4) || (7 < index)) {
      pEVar2->p[index] = value;
    }
    else {
      iVar1 = (int)pEVar2->p[0];
      if (iVar1 < 0) {
        __assert_fail("stream >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                      ,0x66,
                      "int Teleport::SetFloatParameterCallback(UnityAudioEffectState *, int, float)"
                     );
      }
      if (7 < iVar1) {
        __assert_fail("stream < Teleport::NUMSTREAMS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                      ,0x67,
                      "int Teleport::SetFloatParameterCallback(UnityAudioEffectState *, int, float)"
                     );
      }
      this = GetSharedMemory();
      pSVar3 = SharedMemoryHandle::operator->(this);
      pSVar3->streams[iVar1].params[index + -4].changed = 1;
      pSVar3->streams[iVar1].params[index + -4].value = value;
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;

        if (index >= P_PARAM1 && index <= P_PARAM4)
        {
            int stream = (int)data->p[P_STREAM];
            assert(stream >= 0);
            assert(stream < Teleport::NUMSTREAMS);

            SharedMemoryHandle& shared = GetSharedMemory();
            Stream& s = shared->streams[stream];

            s.params[index - P_PARAM1].changed = 1;
            s.params[index - P_PARAM1].value = value;
        }
        else
            data->p[index] = value;

        return UNITY_AUDIODSP_OK;
    }